

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

time_t mz_zip_dos_to_time_t(int dos_time,int dos_date)

{
  time_t tVar1;
  uint in_ESI;
  uint in_EDI;
  tm tm;
  tm local_40;
  uint local_8;
  uint local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  memset(&local_40,0,0x38);
  local_40.tm_isdst = -1;
  local_40.tm_year = ((int)local_8 >> 9 & 0x7fU) + 0x50;
  local_40.tm_mon = ((int)local_8 >> 5 & 0xfU) - 1;
  local_40.tm_mday = local_8 & 0x1f;
  local_40.tm_hour = (int)local_4 >> 0xb & 0x1f;
  local_40.tm_min = (int)local_4 >> 5 & 0x3f;
  local_40.tm_sec = (local_4 & 0x1f) << 1;
  tVar1 = mktime(&local_40);
  return tVar1;
}

Assistant:

static MZ_TIME_T mz_zip_dos_to_time_t(int dos_time, int dos_date) {
  struct tm tm;
  memset(&tm, 0, sizeof(tm));
  tm.tm_isdst = -1;
  tm.tm_year = ((dos_date >> 9) & 127) + 1980 - 1900;
  tm.tm_mon = ((dos_date >> 5) & 15) - 1;
  tm.tm_mday = dos_date & 31;
  tm.tm_hour = (dos_time >> 11) & 31;
  tm.tm_min = (dos_time >> 5) & 63;
  tm.tm_sec = (dos_time << 1) & 62;
  return mktime(&tm);
}